

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void trace_stop(jit_State *J)

{
  char cVar1;
  ushort uVar2;
  uint *puVar3;
  uint64_t uVar4;
  GCtrace *T_00;
  lua_State *L_00;
  TValue *pTVar5;
  long lVar6;
  ptrdiff_t argbase_00;
  GCstr *pGVar7;
  ptrdiff_t argbase;
  GCtrace *root;
  SnapShot *snap;
  lua_State *L;
  GCtrace *T;
  TraceNo traceno;
  GCproto *pt;
  BCOp op;
  BCIns *pc;
  jit_State *J_local;
  
  puVar3 = (uint *)(J->cur).startpc.ptr64;
  cVar1 = (char)(J->cur).startins;
  uVar4 = (J->cur).startpt.gcptr64;
  uVar2 = (J->cur).traceno;
  T_00 = J->curfinal;
  switch(cVar1) {
  case 'A':
  case 'B':
  case 'E':
    *(ushort *)(J->trace[J->exitno].gcptr64 + 0x6a) = uVar2;
    break;
  case 'F':
  case 'J':
  case 'K':
  case 'L':
    *puVar3 = (uint)((J->cur).snap)->nslots << 8 | 0x57 | (uint)uVar2 << 0x10;
    goto LAB_0018acd8;
  case 'O':
    *(char *)(puVar3 + ((ulong)((J->cur).startins >> 0x10) - 0x8000)) = 'N';
  case 'R':
  case 'U':
  case 'Y':
    *(char *)puVar3 = cVar1 + '\x02';
    *(ushort *)((long)puVar3 + 2) = uVar2;
LAB_0018acd8:
    (J->cur).nextroot = *(TraceNo1 *)(uVar4 + 0x3e);
    *(ushort *)(uVar4 + 0x3e) = uVar2;
    break;
  case 'X':
    lj_asm_patchexit(J,(GCtrace *)J->trace[J->parent].gcptr64,J->exitno,(J->cur).mcode);
    lVar6 = *(long *)(J->trace[J->parent].gcptr64 + 0x30) + (ulong)J->exitno * 0xc;
    *(undefined1 *)(lVar6 + 0xb) = 0xff;
    if (*(byte *)(lVar6 + 9) < (J->cur).topslot) {
      *(uint8_t *)(lVar6 + 9) = (J->cur).topslot;
    }
    uVar4 = J->trace[(J->cur).root].gcptr64;
    *(short *)(uVar4 + 100) = *(short *)(uVar4 + 100) + 1;
    (J->cur).nextside = *(TraceNo1 *)(uVar4 + 0x70);
    *(ushort *)(uVar4 + 0x70) = uVar2;
  }
  lj_mcode_commit(J,(J->cur).mcode);
  J->postproc = LJ_POST_NONE;
  trace_save(J,T_00);
  L_00 = J->L;
  if (((*(byte *)((L_00->glref).ptr64 + 0x93) & 2) != 0) &&
     (argbase_00 = lj_vmevent_prepare(L_00,LJ_VMEVENT_TRACE), argbase_00 != 0)) {
    pTVar5 = L_00->top;
    L_00->top = pTVar5 + 1;
    pGVar7 = lj_str_new(L_00,"stop",4);
    pTVar5->u64 = (ulong)pGVar7 | 0xfffd800000000000;
    pTVar5 = L_00->top;
    L_00->top = pTVar5 + 1;
    pTVar5->n = (double)uVar2;
    pTVar5 = L_00->top;
    L_00->top = pTVar5 + 1;
    pTVar5->u64 = (ulong)J->fn | 0xfffb800000000000;
    lj_vmevent_call(L_00,argbase_00);
  }
  return;
}

Assistant:

static void trace_stop(jit_State *J)
{
  BCIns *pc = mref(J->cur.startpc, BCIns);
  BCOp op = bc_op(J->cur.startins);
  GCproto *pt = &gcref(J->cur.startpt)->pt;
  TraceNo traceno = J->cur.traceno;
  GCtrace *T = J->curfinal;
  lua_State *L;

  switch (op) {
  case BC_FORL:
    setbc_op(pc+bc_j(J->cur.startins), BC_JFORI);  /* Patch FORI, too. */
    /* fallthrough */
  case BC_LOOP:
  case BC_ITERL:
  case BC_FUNCF:
    /* Patch bytecode of starting instruction in root trace. */
    setbc_op(pc, (int)op+(int)BC_JLOOP-(int)BC_LOOP);
    setbc_d(pc, traceno);
  addroot:
    /* Add to root trace chain in prototype. */
    J->cur.nextroot = pt->trace;
    pt->trace = (TraceNo1)traceno;
    break;
  case BC_ITERN:
  case BC_RET:
  case BC_RET0:
  case BC_RET1:
    *pc = BCINS_AD(BC_JLOOP, J->cur.snap[0].nslots, traceno);
    goto addroot;
  case BC_JMP:
    /* Patch exit branch in parent to side trace entry. */
    lj_assertJ(J->parent != 0 && J->cur.root != 0, "not a side trace");
    lj_asm_patchexit(J, traceref(J, J->parent), J->exitno, J->cur.mcode);
    /* Avoid compiling a side trace twice (stack resizing uses parent exit). */
    {
      SnapShot *snap = &traceref(J, J->parent)->snap[J->exitno];
      snap->count = SNAPCOUNT_DONE;
      if (J->cur.topslot > snap->topslot) snap->topslot = J->cur.topslot;
    }
    /* Add to side trace chain in root trace. */
    {
      GCtrace *root = traceref(J, J->cur.root);
      root->nchild++;
      J->cur.nextside = root->nextside;
      root->nextside = (TraceNo1)traceno;
    }
    break;
  case BC_CALLM:
  case BC_CALL:
  case BC_ITERC:
    /* Trace stitching: patch link of previous trace. */
    traceref(J, J->exitno)->link = traceno;
    break;
  default:
    lj_assertJ(0, "bad stop bytecode %d", op);
    break;
  }

  /* Commit new mcode only after all patching is done. */
  lj_mcode_commit(J, J->cur.mcode);
  J->postproc = LJ_POST_NONE;
  trace_save(J, T);

  L = J->L;
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "stop"));
    setintV(L->top++, traceno);
    setfuncV(L, L->top++, J->fn);
  );
}